

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>
          (String *__return_storage_ptr__,detail *this,
          vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
          *lhs,char *op,
          vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
          *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"{?}");
  String::String(&local_58,(char *)lhs);
  String::operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  String::operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }